

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase393::run(TestCase393 *this)

{
  StringPtr name;
  StructSchema results;
  DebugExpression<bool> _kjCondition;
  InterfaceSchema schema;
  SchemaLoader loader;
  Schema local_98;
  ArrayPtr<const_char> local_90;
  undefined1 local_80 [64];
  Schema local_40;
  SchemaLoader local_38;
  
  local_90.size_ = (size_t)local_90.ptr;
  SchemaLoader::SchemaLoader(&local_38);
  local_98.raw = (RawBrandedSchema *)(schemas::s_d9d44ddacab3edbe + 0x48);
  Schema::getProto((Reader *)local_80,&local_98);
  local_90.ptr = (char *)SchemaLoader::load(&local_38,(Reader *)local_80);
  local_40.raw = (RawBrandedSchema *)Schema::asInterface((Schema *)&local_90);
  name.content.size_ = 10;
  name.content.ptr = "doStreamI";
  InterfaceSchema::getMethodByName((Method *)local_80,(InterfaceSchema *)&local_40,name);
  local_98.raw = (RawBrandedSchema *)InterfaceSchema::Method::getResultType((Method *)local_80);
  local_80[0] = StructSchema::isStreamResult((StructSchema *)&local_98);
  if (kj::_::Debug::minSeverity < 3 && !local_80[0]) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,400,ERROR,"\"failed: expected \" \"results.isStreamResult()\", _kjCondition",
               (char (*) [42])"failed: expected results.isStreamResult()",
               (DebugExpression<bool> *)local_80);
  }
  local_90 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&local_98);
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[13]> *)local_80,
             (DebugExpression<kj::StringPtr> *)&local_90,(char (*) [13])"StreamResult");
  if ((local_80[0x28] == false) && (kj::_::Debug::minSeverity < 3)) {
    local_90 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&local_98);
    kj::_::Debug::
    log<char_const(&)[65],kj::_::DebugComparison<kj::StringPtr,char_const(&)[13]>&,kj::StringPtr>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x191,ERROR,
               "\"failed: expected \" \"results.getShortDisplayName() == \\\"StreamResult\\\"\", _kjCondition, results.getShortDisplayName()"
               ,(char (*) [65])"failed: expected results.getShortDisplayName() == \"StreamResult\"",
               (DebugComparison<kj::StringPtr,_const_char_(&)[13]> *)local_80,(StringPtr *)&local_90
              );
  }
  SchemaLoader::~SchemaLoader(&local_38);
  return;
}

Assistant:

TEST(SchemaLoader, LoadStreaming) {
  SchemaLoader loader;

  InterfaceSchema schema =
      loader.load(Schema::from<test::TestStreaming>().getProto()).asInterface();

  auto results = schema.getMethodByName("doStreamI").getResultType();
  KJ_EXPECT(results.isStreamResult());
  KJ_EXPECT(results.getShortDisplayName() == "StreamResult", results.getShortDisplayName());
}